

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint32 v;
  int iVar1;
  Type type;
  OneofDescriptor *pOVar2;
  Descriptor *this_00;
  char *pcVar3;
  FieldDescriptor *pFVar4;
  int __c;
  FieldDescriptor *in_RSI;
  long in_RDI;
  size_t offset;
  FieldDescriptor *in_stack_00000038;
  ReflectionSchema *in_stack_00000040;
  undefined4 local_4;
  
  pFVar4 = in_RSI;
  pOVar2 = FieldDescriptor::containing_oneof(in_RSI);
  if (pOVar2 == (OneofDescriptor *)0x0) {
    local_4 = GetFieldOffsetNonOneof(in_stack_00000040,in_stack_00000038);
  }
  else {
    this_00 = FieldDescriptor::containing_type(in_RSI);
    iVar1 = Descriptor::field_count(this_00);
    pOVar2 = FieldDescriptor::containing_oneof(in_RSI);
    pcVar3 = OneofDescriptor::index(pOVar2,(char *)pFVar4,__c);
    pFVar4 = (FieldDescriptor *)(long)(iVar1 + (int)pcVar3);
    v = *(uint32 *)(*(long *)(in_RDI + 8) + (long)pFVar4 * 4);
    type = FieldDescriptor::type(pFVar4);
    local_4 = OffsetValue(v,type);
  }
  return local_4;
}

Assistant:

uint32 GetFieldOffset(const FieldDescriptor* field) const {
    if (field->containing_oneof()) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count() +
                              field->containing_oneof()->index());
      return OffsetValue(offsets_[offset], field->type());
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }